

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZukerAlgorithm.cpp
# Opt level: O3

int __thiscall ZukerAlgorithm::calculate_W(ZukerAlgorithm *this)

{
  pointer piVar1;
  bool bVar2;
  pointer piVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long local_40;
  
  calculate_V(this);
  lVar4 = (long)this->n;
  if (lVar4 < 2) {
    piVar3 = (this->W).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
  }
  else {
    uVar11 = 1;
    local_40 = 4;
    uVar10 = 0xfffffffe;
    do {
      piVar7 = (this->seq->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar2 = basepair(*piVar7,piVar7[uVar11]);
      iVar5 = 10000000;
      iVar6 = 0;
      if (bVar2) {
        piVar7 = (this->seq->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar6 = AU[*piVar7][piVar7[uVar11]] +
                (this->V).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11];
        iVar5 = iVar6;
        if (9999999 < iVar6) {
          iVar5 = 10000000;
        }
        iVar6 = -(uint)(iVar6 < 10000000);
      }
      piVar3 = (this->W).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar3[uVar11 - 1] < iVar5) {
        iVar6 = -2;
        iVar5 = piVar3[uVar11 - 1];
      }
      iVar9 = iVar5;
      if (4 < uVar11) {
        piVar1 = (this->seq->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7 = (int *)(local_40 + (long)this->n * 4 +
                        (long)(this->V).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
        lVar4 = 0;
        do {
          iVar8 = *piVar7 + piVar3[lVar4] + AU[piVar1[lVar4 + 1]][piVar1[uVar11]];
          if (iVar9 <= iVar8) {
            iVar8 = iVar9;
          }
          iVar9 = iVar8;
          lVar4 = lVar4 + 1;
          piVar7 = piVar7 + this->n;
        } while (uVar10 - 1 != lVar4);
      }
      if (iVar9 < iVar5) {
        iVar6 = -4;
      }
      piVar3[uVar11] = iVar9;
      (this->WB).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar11] = iVar6;
      uVar11 = uVar11 + 1;
      lVar4 = (long)this->n;
      uVar10 = (ulong)((int)uVar10 + 1);
      local_40 = local_40 + 4;
    } while ((long)uVar11 < lVar4);
  }
  return piVar3[lVar4 + -1];
}

Assistant:

int ZukerAlgorithm::calculate_W() {
    int min_w = inf, energy = inf, t = 0;

    calculate_V();
    int i = 0;
    for (int j = 1; j < n; ++j) {
        min_w = inf, energy = inf, t = 0;
        if (basepair(seq[i],seq[j])) {
            min_w = min(min_w, V[index(i,j)] + AU[seq[i]][seq[j]]);
            if (energy > min_w) {
                energy = min_w;
                t = -1;
            }
        }
//        de << 1 << " " << min_w << endl;

        min_w = min(min_w, W[index(i,j-1)]);
        if (energy > min_w) {
            energy = min_w;
            t = -2;
        }
//        de << 2 << " " << min_w << endl;

        for (int k = 1; k <= j-4; ++k) {
            min_w = min(min_w, W[index(i,k-1)] + V[index(k,j)] + AU[seq[k]][seq[j]]);
        }
        if (energy > min_w) {
            energy = min_w;
            t = -4;
        }
//        de << 3 << " " << min_w << endl;

        W[index(i,j)] = min_w;
        WB[index(i,j)] = t;
//        de << "Z - l: " << i << ",r: " << j << ",L: " << seq[i] << ",R: " << seq[j] << ",ret: " << min_w  << endl;
    }


    return W[index(0,n-1)];
}